

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O0

xr_reader * __thiscall
xray_re::xr_reader::open_chunk_next(xr_reader *this,uint32_t *_id,xr_reader *prev)

{
  xr_reader *pxVar1;
  uint8_t *local_40;
  uint8_t *data;
  size_t real_size;
  uint32_t size;
  uint32_t id;
  xr_reader *prev_local;
  uint32_t *_id_local;
  xr_reader *this_local;
  
  _size = prev;
  prev_local = (xr_reader *)_id;
  _id_local = (uint32_t *)this;
  if (prev == (xr_reader *)0x0) {
    this->m_next = this->m_data;
  }
  else if (prev != (xr_reader *)0x0) {
    (*prev->_vptr_xr_reader[1])();
  }
  if (this->m_next < this->m_end) {
    if (this->m_end < this->m_next + 8) {
      __assert_fail("m_next + 8 <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x4a,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)")
      ;
    }
    this->field_2 = (anon_union_8_7_9f64dffd_for_xr_reader_2)this->m_next;
    real_size._4_4_ = r_u32(this);
    real_size._0_4_ = r_u32(this);
    if (this->m_end < (this->field_2).m_p + (uint32_t)real_size) {
      __assert_fail("m_p + size <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x4e,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)")
      ;
    }
    this->m_next = (this->field_2).m_p + (uint32_t)real_size;
    *(uint32_t *)&prev_local->_vptr_xr_reader = real_size._4_4_;
    if ((real_size._4_4_ & 0x80000000) == 0) {
      pxVar1 = (xr_reader *)operator_new(0x28);
      xr_reader(pxVar1,(this->field_2).m_p,(ulong)(uint32_t)real_size);
      this_local = pxVar1;
    }
    else {
      xr_lzhuf::decompress(&local_40,(size_t *)&data,(this->field_2).m_p,(ulong)(uint32_t)real_size)
      ;
      pxVar1 = (xr_reader *)operator_new(0x28);
      xr_temp_reader::xr_temp_reader((xr_temp_reader *)pxVar1,local_40,(size_t)data);
      this_local = pxVar1;
    }
  }
  else {
    this_local = (xr_reader *)0x0;
  }
  return this_local;
}

Assistant:

xr_reader* xr_reader::open_chunk_next(uint32_t& _id, xr_reader* prev)
{
	if (prev)
		delete prev;
	else
		m_next = m_data;
	if (m_next < m_end) {
		assert(m_next + 8 <= m_end);
		m_p = m_next;
		uint32_t id = r_u32();
		uint32_t size = r_u32();
		assert(m_p + size <= m_end);
		m_next = m_p + size;
		_id = id;
		if (id & CHUNK_COMPRESSED) {
			size_t real_size;
			uint8_t* data;
			xr_lzhuf::decompress(data, real_size, m_p, size);
			return new xr_temp_reader(data, real_size);
		} else {
			return new xr_reader(m_p, size);
		}
	}
	return 0;
}